

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

void __thiscall Apt::ProjectPosOnStartupPath(Apt *this,positionTy *_pos,StartupLoc *_startLoc)

{
  double dVar1;
  double *pdVar2;
  double *in_RDX;
  positionTy *in_RSI;
  double ln_x1;
  double base_y;
  double base_x;
  double via_y;
  double via_x;
  double start_y;
  double start_x;
  distToLineTy dist;
  double in_stack_ffffffffffffff38;
  double dVar3;
  double in_stack_ffffffffffffff40;
  distToLineTy *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  distToLineTy *res;
  double pt_y;
  double pt_x;
  distToLineTy local_38;
  double *local_18;
  positionTy *local_10;
  
  res = (distToLineTy *)in_RDX[0xc];
  local_18 = in_RDX;
  local_10 = in_RSI;
  pdVar2 = positionTy::heading(in_RSI);
  *pdVar2 = (double)res;
  local_10->f = (posFlagsTy)((ushort)local_10->f & 0xff7f | 0x80);
  local_10->f = (posFlagsTy)((ushort)local_10->f & 0xcfff | 0x1000);
  pdVar2 = positionTy::alt_m(local_10);
  *pdVar2 = NAN;
  distToLineTy::distToLineTy(&local_38);
  dVar3 = local_18[1];
  pdVar2 = positionTy::lon(local_10);
  ln_x1 = dVar3 - *pdVar2;
  positionTy::lat(local_10);
  Lon2Dist(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pt_y = *local_18;
  pdVar2 = positionTy::lat(local_10);
  Lat2Dist(pt_y - *pdVar2);
  pt_x = local_18[0xd];
  positionTy::lon(local_10);
  positionTy::lat(local_10);
  Lon2Dist(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  dVar1 = local_18[0xe];
  pdVar2 = positionTy::lat(local_10);
  Lat2Dist(dVar1 - *pdVar2);
  DistPointToLineSqr(pt_x,pt_y,ln_x1,dVar3,(double)res,(double)in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff50);
  if (local_38.leg2_len2 <= local_38.len2) {
    DistResultToBaseLoc(pt_x,pt_y,ln_x1,dVar3,res,in_stack_ffffffffffffff58,
                        &in_stack_ffffffffffffff50->dist2);
    dVar3 = NAN;
    positionTy::lat(local_10);
    dVar3 = Dist2Lon(in_stack_ffffffffffffff40,dVar3);
    pdVar2 = positionTy::lon(local_10);
    *pdVar2 = dVar3 + *pdVar2;
    dVar3 = Dist2Lat(NAN);
    pdVar2 = positionTy::lat(local_10);
    *pdVar2 = dVar3 + *pdVar2;
  }
  else {
    dVar3 = *local_18;
    pdVar2 = positionTy::lat(local_10);
    *pdVar2 = dVar3;
    dVar3 = local_18[1];
    pdVar2 = positionTy::lon(local_10);
    *pdVar2 = dVar3;
  }
  return;
}

Assistant:

void ProjectPosOnStartupPath (positionTy& _pos, const StartupLoc& _startLoc)
    {
        // One thing is for sure: the heading must match startup location
        _pos.heading() = _startLoc.heading;
        _pos.f.bHeadFixed = true;
        _pos.f.specialPos = SPOS_STARTUP;
        // And the altitude needs re-comupting
        _pos.alt_m() = NAN;
        
        // Compute temporary "coordinates" in meters, relative to the search position
        distToLineTy dist;
        const double start_x = Lon2Dist(_startLoc.lon      - _pos.lon(), _pos.lat());   // x is eastward
        const double start_y = Lat2Dist(_startLoc.lat      - _pos.lat());               // y is northward
        const double via_x   = Lon2Dist(_startLoc.viaPos.x - _pos.lon(), _pos.lat());
        const double via_y   = Lat2Dist(_startLoc.viaPos.y - _pos.lat());
        DistPointToLineSqr(0.0, 0.0, start_x, start_y, via_x, via_y, dist);
        
        // We don't want the plane to crash into the gate, so we stop the plane
        // at the startup location
        if (dist.leg2_len2 > dist.len2)             // is base beyond startup location?
        {
            _pos.lat() = _startLoc.lat;
            _pos.lon() = _startLoc.lon;
        } else {
            // otherwise move to projection on the path to the startup location
            double base_x = NAN, base_y = NAN;
            DistResultToBaseLoc(start_x, start_y,
                                via_x, via_y,
                                dist, base_x, base_y);
            _pos.lon() += Dist2Lon(base_x, _pos.lat());
            _pos.lat() += Dist2Lat(base_y);
        }
    }